

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::GLSL420Pack::QualifierOrderUniformTest::prepareNextTestCase
          (QualifierOrderUniformTest *this,GLuint test_case_index)

{
  ostringstream *this_00;
  long lVar1;
  GLchar *pGVar2;
  pointer pvVar3;
  ulong uVar4;
  uint uVar5;
  MessageBuilder message;
  
  uVar4 = (ulong)test_case_index;
  this->m_current_test_case_index = test_case_index;
  if (test_case_index == 0xffffffff) {
    pvVar3 = (this->m_test_cases).
             super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = 0;
  }
  else {
    pvVar3 = (this->m_test_cases).
             super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->m_test_cases).
                       super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3) / 0x18) <=
        (ulong)test_case_index) {
      return false;
    }
  }
  message.m_log =
       ((this->super_GLSLTestBase).super_TestBase.super_TestCase.m_context)->m_testCtx->m_log;
  this_00 = &message.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  uVar5 = 0;
  while( true ) {
    lVar1 = *(long *)&pvVar3[uVar4].
                      super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                      ._M_impl.super__Vector_impl_data;
    if ((ulong)((long)*(pointer *)
                       ((long)&pvVar3[uVar4].
                               super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                               ._M_impl.super__Vector_impl_data + 8) - lVar1 >> 2) <= (ulong)uVar5)
    break;
    pGVar2 = Utils::getQualifierString(*(QUALIFIERS *)(lVar1 + (ulong)uVar5 * 4));
    std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,pGVar2);
    std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>," ");
    uVar5 = uVar5 + 1;
  }
  tcu::MessageBuilder::operator<<(&message,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  return true;
}

Assistant:

bool QualifierOrderUniformTest::prepareNextTestCase(glw::GLuint test_case_index)
{
	m_current_test_case_index = test_case_index;

	if ((glw::GLuint)-1 == test_case_index)
	{
		/* Nothing to be done here */;
	}
	else if (m_test_cases.size() <= test_case_index)
	{
		return false;
	}

	const Utils::qualifierSet& set = getCurrentTestCase();

	tcu::MessageBuilder message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

	for (GLuint i = 0; i < set.size(); ++i)
	{
		message << Utils::getQualifierString(set[i]) << " ";
	}

	message << tcu::TestLog::EndMessage;

	return true;
}